

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

void __thiscall
capnp::DynamicList::Builder::adopt(Builder *this,uint index,Orphan<capnp::DynamicValue> *orphan)

{
  StructBuilder other;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  bool bVar4;
  Which WVar5;
  uint uVar6;
  StructSchema SVar7;
  InterfaceSchema other_00;
  uint uVar8;
  bool _kjCondition_3;
  undefined7 uStack_bf;
  DebugComparison<capnp::DynamicValue::Type,_capnp::DynamicValue::Type> _kjCondition;
  undefined4 local_98;
  Fault f;
  StructBuilder local_48;
  
  WVar5 = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    WVar5 = (this->schema).elementType.baseType;
  }
  if (WVar5 < TEXT) {
switchD_001baa91_caseD_f:
    Orphan<capnp::DynamicValue>::getReader((Reader *)&_kjCondition,orphan);
    set(this,index,(Reader *)&_kjCondition);
    sVar3 = _kjCondition.op.content.size_;
    if ((_kjCondition.left == CAPABILITY) && (_kjCondition.op.content.size_ != 0)) {
      _kjCondition.op.content.size_ = 0;
      (*(code *)**(undefined8 **)_kjCondition.op.content.ptr)
                (_kjCondition.op.content.ptr,sVar3 + *(long *)(*(long *)sVar3 + -0x10));
    }
  }
  else {
    switch(WVar5) {
    case TEXT:
      _kjCondition.right = TEXT;
      _kjCondition.left = orphan->type;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = orphan->type == TEXT;
      if (!_kjCondition.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type,capnp::DynamicValue::Type>&,char_const(&)[21]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x52b,FAILED,"orphan.getType() == DynamicValue::TEXT",
                   "_kjCondition,\"Value type mismatch.\"",&_kjCondition,
                   (char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::fatal(&f);
      }
      break;
    case DATA:
      _kjCondition.right = DATA;
      _kjCondition.left = orphan->type;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = orphan->type == DATA;
      if (!_kjCondition.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type,capnp::DynamicValue::Type>&,char_const(&)[21]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x530,FAILED,"orphan.getType() == DynamicValue::DATA",
                   "_kjCondition,\"Value type mismatch.\"",&_kjCondition,
                   (char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::fatal(&f);
      }
      break;
    case LIST:
      _f = (Type)Type::asList((Type *)this);
      if (orphan->type != LIST) {
        __kjCondition_3 = __kjCondition_3 & 0xffffffffffffff00;
LAB_001bad6c:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[21]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x537,FAILED,
                   "orphan.getType() == DynamicValue::LIST && orphan.listSchema == elementType",
                   "_kjCondition,\"Value type mismatch.\"",&_kjCondition_3,
                   (char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
      bVar4 = Type::operator==((Type *)&(orphan->field_1).enumValue,(Type *)&f);
      _kjCondition_3 = bVar4;
      if (!bVar4) goto LAB_001bad6c;
      break;
    case ENUM:
      goto switchD_001baa91_caseD_f;
    case STRUCT:
      SVar7 = Type::asStruct((Type *)this);
      if (orphan->type == STRUCT) {
        f.exception._0_1_ = (RawBrandedSchema *)(orphan->field_1).intValue == SVar7.super_Schema.raw
        ;
        if ((bool)f.exception._0_1_) {
          _::ListBuilder::getStructElement((StructBuilder *)&f,&this->builder,index);
          __kjCondition_3 = SVar7.super_Schema.raw;
          Schema::getProto((Reader *)&_kjCondition,(Schema *)&_kjCondition_3);
          uVar8 = 0;
          uVar6 = 0;
          if (0x7f < (uint)local_98) {
            uVar6 = (uint)*(ushort *)(_kjCondition.op.content.size_ + 0xe);
          }
          if (0xcf < (uint)local_98) {
            uVar8 = (uint)*(ushort *)(_kjCondition.op.content.size_ + 0x18) << 0x10;
          }
          _::OrphanBuilder::asStruct(&local_48,&orphan->builder,(StructSize)(uVar8 | uVar6));
          other.capTable = local_48.capTable;
          other.segment = local_48.segment;
          other.data = local_48.data;
          other.pointers = local_48.pointers;
          other.dataSize = local_48.dataSize;
          other.pointerCount = local_48.pointerCount;
          other._38_2_ = local_48._38_2_;
          _::StructBuilder::transferContentFrom((StructBuilder *)&f,other);
          return;
        }
      }
      else {
        auVar1[0xf] = 0;
        auVar1._0_15_ = stack0xffffffffffffff91;
        _f = (Type)(auVar1 << 8);
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[21]>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x53f,FAILED,
                 "orphan.getType() == DynamicValue::STRUCT && orphan.structSchema == elementType",
                 "_kjCondition,\"Value type mismatch.\"",(bool *)&f,
                 (char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    case INTERFACE:
      other_00 = Type::asInterface((Type *)this);
      if (orphan->type != CAPABILITY) {
        auVar2[0xf] = 0;
        auVar2._0_15_ = stack0xffffffffffffff91;
        _f = (Type)(auVar2 << 8);
LAB_001badb5:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[21]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x54c,FAILED,
                   "orphan.getType() == DynamicValue::CAPABILITY && orphan.interfaceSchema.extends(elementType)"
                   ,"_kjCondition,\"Value type mismatch.\"",(bool *)&f,
                   (char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
      f.exception._0_1_ = InterfaceSchema::extends(&(orphan->field_1).interfaceSchema,other_00);
      if (!(bool)f.exception._0_1_) goto LAB_001badb5;
      break;
    case ANY_POINTER:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x546,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
                 (char (*) [32])"List(AnyPointer) not supported.");
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    default:
      kj::_::unreachable();
    }
    _kjCondition._0_8_ = (this->builder).segment;
    _kjCondition.op.content.ptr = (char *)(this->builder).capTable;
    _kjCondition.op.content.size_ =
         (size_t)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
    _::PointerBuilder::adopt((PointerBuilder *)&_kjCondition,&orphan->builder);
  }
  return;
}

Assistant:

void DynamicList::Builder::adopt(uint index, Orphan<DynamicValue>&& orphan) {
  switch (schema.whichElementType()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::ENUM:
      set(index, orphan.getReader());
      return;

    case schema::Type::TEXT:
      KJ_REQUIRE(orphan.getType() == DynamicValue::TEXT, "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;

    case schema::Type::DATA:
      KJ_REQUIRE(orphan.getType() == DynamicValue::DATA, "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;

    case schema::Type::LIST: {
      ListSchema elementType = schema.getListElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::LIST && orphan.listSchema == elementType,
                 "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;
    }

    case schema::Type::STRUCT: {
      auto elementType = schema.getStructElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::STRUCT && orphan.structSchema == elementType,
                 "Value type mismatch.");
      builder.getStructElement(bounded(index) * ELEMENTS).transferContentFrom(
          orphan.builder.asStruct(structSizeFromSchema(elementType)));
      return;
    }

    case schema::Type::ANY_POINTER:
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");

    case schema::Type::INTERFACE: {
      auto elementType = schema.getInterfaceElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::CAPABILITY &&
                 orphan.interfaceSchema.extends(elementType),
                 "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;
    }
  }

  KJ_UNREACHABLE;
}